

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_generator.cc
# Opt level: O1

void __thiscall re2::StringGenerator::Random(StringGenerator *this,int32 seed,int n)

{
  ACMRandom *pAVar1;
  
  if (this->acm_ == (ACMRandom *)0x0) {
    pAVar1 = (ACMRandom *)operator_new(4);
    pAVar1->seed_ = seed;
    this->acm_ = pAVar1;
  }
  else {
    this->acm_->seed_ = seed;
  }
  this->random_ = true;
  this->nrandom_ = n;
  this->hasnext_ = 0 < n;
  return;
}

Assistant:

void StringGenerator::Random(int32 seed, int n) {
  if (acm_ == NULL)
    acm_ = new ACMRandom(seed);
  else
    acm_->Reset(seed);

  random_ = true;
  nrandom_ = n;
  hasnext_ = nrandom_ > 0;
}